

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

void fl_sendClientMessage
               (Window window,Atom message,unsigned_long d0,unsigned_long d1,unsigned_long d2,
               unsigned_long d3,unsigned_long d4)

{
  undefined4 local_f8 [2];
  XEvent e;
  unsigned_long d3_local;
  unsigned_long d2_local;
  unsigned_long d1_local;
  unsigned_long d0_local;
  Atom message_local;
  Window window_local;
  
  local_f8[0] = 0x21;
  e.xfocus.mode = 0x20;
  e.pad[10] = d4;
  e.xerror.serial = window;
  e.xany.window = message;
  e.xkey.subwindow = d0;
  e.xkey.time = d1;
  e.xselectionrequest.property = d2;
  e.xconfigure.above = d3;
  e.pad[0x17] = d3;
  d3_local = d2;
  d2_local = d1;
  d1_local = d0;
  d0_local = message;
  message_local = window;
  XSendEvent(fl_display,window,0,0,local_f8);
  return;
}

Assistant:

void fl_sendClientMessage(Window window, Atom message,
                                 unsigned long d0,
                                 unsigned long d1=0,
                                 unsigned long d2=0,
                                 unsigned long d3=0,
                                 unsigned long d4=0)
{
  XEvent e;
  e.xany.type = ClientMessage;
  e.xany.window = window;
  e.xclient.message_type = message;
  e.xclient.format = 32;
  e.xclient.data.l[0] = (long)d0;
  e.xclient.data.l[1] = (long)d1;
  e.xclient.data.l[2] = (long)d2;
  e.xclient.data.l[3] = (long)d3;
  e.xclient.data.l[4] = (long)d4;
  XSendEvent(fl_display, window, 0, 0, &e);
}